

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void event_changelist_remove_all_(event_changelist *changelist,event_base *base)

{
  event_changelist_fdinfo *peVar1;
  event_changelist_fdinfo *fdinfo;
  event_change *ch;
  int i;
  event_base *base_local;
  event_changelist *changelist_local;
  
  ch._4_4_ = 0;
  while( true ) {
    if (changelist->n_changes <= ch._4_4_) {
      changelist->n_changes = 0;
      return;
    }
    peVar1 = event_change_get_fdinfo(base,changelist->changes + ch._4_4_);
    if (peVar1->idxplus1 != ch._4_4_ + 1) break;
    peVar1->idxplus1 = 0;
    ch._4_4_ = ch._4_4_ + 1;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,0x316,"fdinfo->idxplus1 == i + 1","event_changelist_remove_all_");
}

Assistant:

void
event_changelist_remove_all_(struct event_changelist *changelist,
    struct event_base *base)
{
	int i;

	event_changelist_check(base);

	for (i = 0; i < changelist->n_changes; ++i) {
		struct event_change *ch = &changelist->changes[i];
		struct event_changelist_fdinfo *fdinfo =
		    event_change_get_fdinfo(base, ch);
		EVUTIL_ASSERT(fdinfo->idxplus1 == i + 1);
		fdinfo->idxplus1 = 0;
	}

	changelist->n_changes = 0;

	event_changelist_check(base);
}